

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O2

void __thiscall
ncnn::Pooling::make_padding(Pooling *this,Mat *bottom_blob,Mat *bottom_blob_bordered,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float v;
  Option opt_b;
  
  iVar3 = bottom_blob->w;
  iVar1 = bottom_blob->h;
  Mat::operator=(bottom_blob_bordered,bottom_blob);
  v = 0.0;
  if (this->pooling_type == 0) {
    v = *(float *)(&DAT_0015c0d4 + (ulong)(bottom_blob->elemsize == 1) * 4);
  }
  switch(this->pad_mode) {
  case 0:
    iVar6 = this->pad_left;
    iVar5 = ((iVar3 + iVar6 + this->pad_right) - this->kernel_w) % this->stride_w;
    iVar3 = this->pad_top;
    iVar4 = ((iVar1 + iVar3 + this->pad_bottom) - this->kernel_h) % this->stride_h;
    iVar2 = this->stride_w - iVar5;
    if (iVar5 == 0) {
      iVar2 = 0;
    }
    iVar1 = this->stride_h - iVar4;
    if (iVar4 == 0) {
      iVar1 = 0;
    }
    opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_b.use_packing_layout = opt->use_packing_layout;
    opt_b.use_shader_pack8 = opt->use_shader_pack8;
    opt_b.use_bf16_storage = opt->use_bf16_storage;
    opt_b._36_4_ = *(undefined4 *)&opt->field_0x24;
    opt_b.lightmode = opt->lightmode;
    opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_b.num_threads = opt->num_threads;
    opt_b.workspace_allocator = opt->workspace_allocator;
    opt_b.use_winograd_convolution = opt->use_winograd_convolution;
    opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_b.use_int8_inference = opt->use_int8_inference;
    opt_b.use_vulkan_compute = opt->use_vulkan_compute;
    opt_b.use_fp16_packed = opt->use_fp16_packed;
    opt_b.use_fp16_storage = opt->use_fp16_storage;
    opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_b.use_int8_storage = opt->use_int8_storage;
    opt_b.blob_allocator = opt->workspace_allocator;
    iVar1 = iVar1 + this->pad_bottom;
    iVar2 = iVar2 + this->pad_right;
    break;
  case 1:
    opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_b.use_packing_layout = opt->use_packing_layout;
    opt_b.use_shader_pack8 = opt->use_shader_pack8;
    opt_b.use_bf16_storage = opt->use_bf16_storage;
    opt_b._36_4_ = *(undefined4 *)&opt->field_0x24;
    opt_b.lightmode = opt->lightmode;
    opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_b.num_threads = opt->num_threads;
    opt_b.workspace_allocator = opt->workspace_allocator;
    opt_b.use_winograd_convolution = opt->use_winograd_convolution;
    opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_b.use_int8_inference = opt->use_int8_inference;
    opt_b.use_vulkan_compute = opt->use_vulkan_compute;
    opt_b.use_fp16_packed = opt->use_fp16_packed;
    opt_b.use_fp16_storage = opt->use_fp16_storage;
    opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_b.use_int8_storage = opt->use_int8_storage;
    opt_b.blob_allocator = opt->workspace_allocator;
    iVar3 = this->pad_top;
    iVar1 = this->pad_bottom;
    iVar6 = this->pad_left;
    iVar2 = this->pad_right;
    break;
  case 2:
    iVar2 = ~((iVar3 + -1) % this->stride_w) + this->kernel_w;
    iVar1 = ~((iVar1 + -1) % this->stride_h) + this->kernel_h;
    if ((iVar2 < 1) && (iVar1 < 1)) {
      return;
    }
    opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_b.use_packing_layout = opt->use_packing_layout;
    opt_b.use_shader_pack8 = opt->use_shader_pack8;
    opt_b.use_bf16_storage = opt->use_bf16_storage;
    opt_b._36_4_ = *(undefined4 *)&opt->field_0x24;
    opt_b.lightmode = opt->lightmode;
    opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_b.num_threads = opt->num_threads;
    opt_b.workspace_allocator = opt->workspace_allocator;
    opt_b.use_winograd_convolution = opt->use_winograd_convolution;
    opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_b.use_int8_inference = opt->use_int8_inference;
    opt_b.use_vulkan_compute = opt->use_vulkan_compute;
    opt_b.use_fp16_packed = opt->use_fp16_packed;
    opt_b.use_fp16_storage = opt->use_fp16_storage;
    opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_b.use_int8_storage = opt->use_int8_storage;
    opt_b.blob_allocator = opt->workspace_allocator;
    iVar3 = iVar1 / 2;
    iVar1 = iVar1 - iVar3;
    iVar6 = iVar2 / 2;
    iVar2 = iVar2 - iVar6;
    break;
  case 3:
    iVar6 = ~((iVar3 + -1) % this->stride_w) + this->kernel_w;
    iVar3 = ~((iVar1 + -1) % this->stride_h) + this->kernel_h;
    if ((iVar6 < 1) && (iVar3 < 1)) {
      return;
    }
    opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_b.use_packing_layout = opt->use_packing_layout;
    opt_b.use_shader_pack8 = opt->use_shader_pack8;
    opt_b.use_bf16_storage = opt->use_bf16_storage;
    opt_b._36_4_ = *(undefined4 *)&opt->field_0x24;
    opt_b.lightmode = opt->lightmode;
    opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_b.num_threads = opt->num_threads;
    opt_b.workspace_allocator = opt->workspace_allocator;
    opt_b.use_winograd_convolution = opt->use_winograd_convolution;
    opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_b.use_int8_inference = opt->use_int8_inference;
    opt_b.use_vulkan_compute = opt->use_vulkan_compute;
    opt_b.use_fp16_packed = opt->use_fp16_packed;
    opt_b.use_fp16_storage = opt->use_fp16_storage;
    opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_b.use_int8_storage = opt->use_int8_storage;
    opt_b.blob_allocator = opt->workspace_allocator;
    iVar1 = iVar3 / 2;
    iVar3 = iVar3 - iVar1;
    iVar2 = iVar6 / 2;
    iVar6 = iVar6 - iVar2;
    break;
  default:
    goto switchD_0012d097_default;
  }
  copy_make_border(bottom_blob,bottom_blob_bordered,iVar3,iVar1,iVar6,iVar2,0,v,&opt_b);
switchD_0012d097_default:
  return;
}

Assistant:

void Pooling::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;

    bottom_blob_bordered = bottom_blob;

    float pad_value = 0.f;
    if (pooling_type == PoolMethod_MAX)
    {
        pad_value = bottom_blob.elemsize == 1 ? -128.f : -FLT_MAX;
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        pad_value = 0.f;
    }

    int wtailpad = 0;
    int htailpad = 0;

    if (pad_mode == 0) // full padding
    {
        int wtail = (w + pad_left + pad_right - kernel_w) % stride_w;
        int htail = (h + pad_top + pad_bottom - kernel_h) % stride_h;

        if (wtail != 0)
            wtailpad = stride_w - wtail;
        if (htail != 0)
            htailpad = stride_h - htail;

        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom + htailpad, pad_left, pad_right + wtailpad, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_mode == 1) // valid padding
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_mode == 2) // tensorflow padding=SAME or onnx padding=SAME_UPPER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_mode == 3) // onnx padding=SAME_LOWER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}